

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O0

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
serve_static_content<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,string *path,romfs *file_system)

{
  anon_class_32_4_bb30a193 f;
  string *__file;
  ulong uVar1;
  char *pcVar2;
  not_null<const_char_*> local_78;
  error_or<pstore::romfs::stat> local_70;
  string *local_50;
  descriptor<pstore::details::posix_descriptor_traits> *pdStack_48;
  string **local_40;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
  *prStack_38;
  string *local_30;
  romfs *file_system_local;
  string *path_local;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  local_30 = path;
  file_system_local = (romfs *)io._M_data;
  path_local = (string *)this;
  sender_local = sender;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)io._M_data,"/");
  }
  pcVar2 = (char *)std::__cxx11::string::back();
  if (*pcVar2 == '/') {
    std::__cxx11::string::operator+=((string *)io._M_data,"index.html");
  }
  __file = local_30;
  local_50 = local_30;
  local_40 = &path_local;
  prStack_38 = (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                *)&sender_local;
  pdStack_48 = io._M_data;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pstore::gsl::not_null<const_char_*>::not_null(&local_78,pcVar2);
  pstore::romfs::romfs::stat((romfs *)&local_70,(char *)__file,(stat *)local_78.ptr_);
  f.path = (string *)pdStack_48;
  f.file_system = (romfs *)local_50;
  f.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
              **)local_40;
  f.io = prStack_38;
  pstore::operator>>=(__return_storage_ptr__,&local_70,f);
  error_or<pstore::romfs::stat>::~error_or(&local_70);
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> serve_static_content (Sender sender, IO io, std::string path,
                                                   pstore::romfs::romfs const & file_system) {
            if (path.empty ()) {
                path = "/";
            }
            if (path.back () == '/') {
                path += "index.html";
            }

            return file_system.stat (path.c_str ()) >>= [&] (pstore::romfs::stat const & stat) {
                return file_system.open (path.c_str ()) >>= [&] (pstore::romfs::descriptor fd) {
                    // Send the response header.
                    std::ostringstream os;
                    os << "HTTP/1.0 200 OK" << crlf               //
                       << "Server: " << server_name << crlf       //
                       << "Content-length: " << stat.size << crlf //
                       << "Content-type: " << pstore::http::media_type_from_filename (path)
                       << crlf //
                       << "Connection: close"
                       << crlf // TODO remove this when we support persistent connections
                       << "Date: " << http_date (std::chrono::system_clock::now ()) << crlf //
                       << "Last-Modified: " << http_date (stat.mtime) << crlf               //
                       << crlf;
                    return send (sender, io, os.str ()) >>=
                           [&] (IO io2) { return details::read_and_send (sender, io2, fd); };
                };
            };
        }